

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O1

VertexBufferId __thiscall
CS248::GLResourceManager::createVertexBufferFromData(GLResourceManager *this,float *data,int num)

{
  pointer *__ptr;
  GLuint *pGVar1;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> buffer_bind;
  GLuint id;
  long *local_28;
  GLuint local_1c;
  
  pGVar1 = &local_1c;
  (*__glewGenBuffers)(1,pGVar1);
  bindVertexBuffer((GLResourceManager *)&local_28,(VertexBufferId)(GLuint)pGVar1);
  (*__glewBufferData)(0x8892,(long)num << 2,data,0x88e4);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return (VertexBufferId)local_1c;
}

Assistant:

VertexBufferId GLResourceManager::createVertexBufferFromData(const float* data, int num) {
  GLuint id;
  glGenBuffers(1, &id);
  VertexBufferId vbid{id};
  auto buffer_bind = bindVertexBuffer(vbid);
  glBufferData(GL_ARRAY_BUFFER, sizeof(float) * num, (const void*) data, GL_STATIC_DRAW);
  return vbid;
}